

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stat.cpp
# Opt level: O3

vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
* __thiscall
csv::CSVStat::get_dtypes
          (vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
           *__return_storage_ptr__,CSVStat *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    CSVReader::get_col_names_abi_cxx11_(&local_48,&this->reader);
    lVar1 = (long)local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((ulong)(lVar1 >> 5) <= uVar2) break;
    std::
    vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
    ::push_back(__return_storage_ptr__,
                (value_type *)
                ((long)&(((this->dtypes).
                          super__Vector_base<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_h)._M_buckets + lVar3));
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x38;
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<CSVStat::TypeCount> CSVStat::get_dtypes() const {
        std::vector<TypeCount> ret;        
        for (size_t i = 0; i < this->get_col_names().size(); i++) {
            ret.push_back(this->dtypes[i]);
        }
        return ret;
    }